

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void colmajor_to_rowmajor<double,unsigned_long>
               (double *Xc,unsigned_long *Xc_ind,unsigned_long *Xc_indptr,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *Xr,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_ind,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_indptr)

{
  pointer puVar1;
  ulong *puVar2;
  size_type __n;
  ulong uVar3;
  pointer pdVar4;
  size_t sVar5;
  unsigned_long uVar6;
  ulong uVar7;
  pointer puVar8;
  size_type sVar9;
  unsigned_long uVar10;
  allocator_type local_69;
  vector<unsigned_long,_std::allocator<unsigned_long>_> argsorted_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_indices;
  
  __n = Xc_indptr[ncols];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&row_indices,__n,(allocator_type *)&argsorted_indices);
  sVar5 = 0;
  while (sVar5 != ncols) {
    puVar2 = Xc_indptr + sVar5;
    uVar3 = Xc_indptr[sVar5 + 1];
    sVar5 = sVar5 + 1;
    for (uVar7 = *puVar2; uVar7 < uVar3; uVar7 = uVar7 + 1) {
      row_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = Xc_ind[uVar7];
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&argsorted_indices,__n,&local_69);
  uVar6 = 0;
  for (puVar8 = argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar8 != argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
    *puVar8 = uVar6;
    uVar6 = uVar6 + 1;
  }
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<colmajor_to_rowmajor<double,unsigned_long>(double_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_utils_hpp:3655:22)>
              )&row_indices);
  std::vector<double,_std::allocator<double>_>::resize(Xr,__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Xr_ind,__n);
  pdVar4 = (Xr->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  puVar8 = (Xr_ind->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
    uVar6 = argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar9];
    pdVar4[sVar9] = Xc[uVar6];
    puVar8[sVar9] = Xc_ind[uVar6];
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Xr_indptr,nrows + 1);
  puVar8 = (Xr_indptr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar10 = 0;
  for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
    if (row_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start
        [argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start[sVar9]] == uVar6) {
      uVar10 = uVar10 + 1;
    }
    else {
      puVar8[uVar6 + 1] = uVar10;
      uVar6 = row_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar9]];
      uVar10 = 0;
    }
  }
  puVar8 = (Xr_indptr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar7 = 1; uVar7 < nrows; uVar7 = uVar7 + 1) {
    puVar1 = puVar8 + uVar7 + 1;
    *puVar1 = *puVar1 + puVar8[uVar7];
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&argsorted_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&row_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                          size_t nrows, size_t ncols,
                          std::vector<double> &Xr, std::vector<size_t> &Xr_ind, std::vector<size_t> &Xr_indptr)
{
    /* First convert to COO */
    size_t nnz = Xc_indptr[ncols];
    std::vector<size_t> row_indices(nnz);
    for (size_t col = 0; col < ncols; col++)
    {
        for (sparse_ix ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
        {
            row_indices[ix] = Xc_ind[ix];
        }
    }

    /* Then copy the data argsorted by rows */
    std::vector<size_t> argsorted_indices(nnz);
    std::iota(argsorted_indices.begin(), argsorted_indices.end(), (size_t)0);
    std::stable_sort(argsorted_indices.begin(), argsorted_indices.end(),
                     [&row_indices](const size_t a, const size_t b)
                     {return row_indices[a] < row_indices[b];});
    Xr.resize(nnz);
    Xr_ind.resize(nnz);
    for (size_t ix = 0; ix < nnz; ix++)
    {
        Xr[ix] = Xc[argsorted_indices[ix]];
        Xr_ind[ix] = Xc_ind[argsorted_indices[ix]];
    }

    /* Now build the index pointer */
    Xr_indptr.resize(nrows+1);
    size_t curr_row = 0;
    size_t curr_n = 0;
    for (size_t ix = 0; ix < nnz; ix++)
    {
        if (row_indices[argsorted_indices[ix]] != curr_row)
        {
            Xr_indptr[curr_row+1] = curr_n;
            curr_n = 0;
            curr_row = row_indices[argsorted_indices[ix]];
        }

        else
        {
            curr_n++;
        }
    }
    for (size_t row = 1; row < nrows; row++)
        Xr_indptr[row+1] += Xr_indptr[row];
}